

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::shrSI64x2(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *other_00;
  bool bVar1;
  bool bVar2;
  long lVar3;
  Literal *this_00;
  Literal local_98;
  undefined1 local_80 [8];
  LaneArray<2> lanes;
  
  if ((other->type).id != 2) {
    __assert_fail("shift.type == Type::i32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                  ,0x785,
                  "Literal wasm::shift(const Literal &, const Literal &) [Lanes = 2, IntoLanes = &wasm::Literal::getLanesI64x2, ShiftOp = &wasm::Literal::shrS]"
                 );
  }
  this_00 = (Literal *)local_80;
  getLanesI64x2((LaneArray<2> *)this_00,this);
  other_00 = &lanes._M_elems[1].type;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    if ((other->type).id != 2) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x118,"int32_t wasm::Literal::geti32() const");
    }
    lanes._M_elems[1].type.id._0_4_ = (other->field_0).i32 & 0x3f;
    shrS(&local_98,this_00,(Literal *)other_00);
    ~Literal(this_00);
    Literal(this_00,&local_98);
    ~Literal(&local_98);
    ~Literal((Literal *)other_00);
    this_00 = (Literal *)&lanes._M_elems[0].type;
    bVar1 = false;
  } while (bVar2);
  Literal(__return_storage_ptr__,(LaneArray<2> *)local_80);
  lVar3 = 0x18;
  do {
    ~Literal((Literal *)(local_80 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::shrSI64x2(const Literal& other) const {
  return shift<2, &Literal::getLanesI64x2, &Literal::shrS>(*this, other);
}